

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * format_int(char *t,int64_t i)

{
  long lVar1;
  char *pcVar2;
  ulong local_28;
  ulong local_20;
  uint64_t ui;
  int64_t i_local;
  char *t_local;
  
  local_20 = i;
  pcVar2 = t;
  if (i < 0) {
    if (i == -0x8000000000000000) {
      local_28 = 0x8000000000000000;
    }
    else {
      local_28 = -i;
    }
    local_20 = local_28;
    pcVar2 = t;
  }
  do {
    i_local = (int64_t)pcVar2;
    *(char *)(i_local + -1) =
         "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[local_20 % 10 + 0x35];
    local_20 = local_20 / 10;
    pcVar2 = (char *)(i_local + -1);
  } while (local_20 != 0);
  lVar1 = i_local + -1;
  if (i < 0) {
    *(undefined1 *)(i_local + -2) = 0x2d;
    lVar1 = i_local + -2;
  }
  i_local = lVar1;
  return (char *)i_local;
}

Assistant:

static char *
format_int(char *t, int64_t i)
{
	uint64_t ui;

	if (i < 0) 
		ui = (i == INT64_MIN) ? (uint64_t)(INT64_MAX) + 1 : (uint64_t)(-i);
	else
		ui = i;

	do {
		*--t = "0123456789"[ui % 10];
	} while (ui /= 10);
	if (i < 0)
		*--t = '-';
	return (t);
}